

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JPG.cpp
# Opt level: O1

byte getBinaryLengthByValue(int value)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  
  if (value != 0) {
    uVar3 = (ulong)(uint)-value;
    if (0 < value) {
      uVar3 = (ulong)(uint)value;
    }
    bVar1 = '\0';
    do {
      bVar1 = bVar1 + '\x01';
      uVar2 = (uint)uVar3;
      uVar3 = uVar3 >> 1;
    } while (1 < uVar2);
    return bVar1;
  }
  return '\0';
}

Assistant:

byte getBinaryLengthByValue(int value) {
    value = value < 0 ? (-value) : value;
    byte result = 0;
    while(value != 0) {
        value = value >> 1;
        result = result + 1;
    }
    return result;    
}